

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_buffered_region.h
# Opt level: O3

void __thiscall
S2ShapeIndexBufferedRegion::S2ShapeIndexBufferedRegion
          (S2ShapeIndexBufferedRegion *this,S2ShapeIndex *index,S1ChordAngle radius)

{
  pointer pSVar1;
  S1ChordAngle SVar2;
  S1ChordAngle local_40;
  double local_38;
  double local_30;
  S1ChordAngle local_28;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2ShapeIndexBufferedRegion_002bd0c0;
  (this->radius_).length2_ = radius.length2_;
  local_28.length2_ = radius.length2_;
  SVar2 = S1ChordAngle::Successor(&local_28);
  (this->radius_successor_).length2_ = SVar2.length2_;
  S1ChordAngle::S1ChordAngle(&local_40,INFINITY);
  local_30 = local_40.length2_;
  S1ChordAngle::S1ChordAngle(&local_40,0.0);
  local_38 = local_40.length2_;
  S1ChordAngle::S1ChordAngle(&local_40,INFINITY);
  (this->query_).options_.super_Options.max_distance_.super_S1ChordAngle.length2_ =
       local_40.length2_;
  S1ChordAngle::S1ChordAngle(&local_40,0.0);
  (this->query_).options_.super_Options.max_error_.length2_ = local_40.length2_;
  (this->query_).options_.super_Options.max_results_ = 0x7fffffff;
  (this->query_).options_.super_Options.include_interiors_ = true;
  (this->query_).options_.super_Options.use_brute_force_ = false;
  S2ClosestEdgeQueryBase<S2MinDistance>::S2ClosestEdgeQueryBase(&(this->query_).base_);
  (this->query_).options_.super_Options.max_distance_.super_S1ChordAngle.length2_ = local_30;
  (this->query_).options_.super_Options.max_error_.length2_ = local_38;
  (this->query_).options_.super_Options.max_results_ = 0x7fffffff;
  (this->query_).options_.super_Options.include_interiors_ = true;
  (this->query_).options_.super_Options.use_brute_force_ = false;
  (this->query_).base_.index_ = index;
  (this->query_).base_.index_num_edges_ = 0;
  (this->query_).base_.index_num_edges_limit_ = 0;
  pSVar1 = (this->query_).base_.index_covering_.
           super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((this->query_).base_.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar1) {
    (this->query_).base_.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  absl::InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
  clear(&(this->query_).base_.index_cells_);
  (this->query_).options_.super_Options.include_interiors_ = true;
  return;
}

Assistant:

inline S2ShapeIndexBufferedRegion::S2ShapeIndexBufferedRegion(
    const S2ShapeIndex* index, S1ChordAngle radius)
    : radius_(radius), radius_successor_(radius.Successor()), query_(index) {
  query_.mutable_options()->set_include_interiors(true);
}